

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluGLContextFactory.cpp
# Opt level: O3

RenderContext * __thiscall
eglu::GLContextFactory::createContext
          (GLContextFactory *this,RenderConfig *config,CommandLine *cmdLine)

{
  Functions *this_00;
  SurfaceType SVar1;
  NativeDisplay *nativeDisplay;
  _func_int **pp_Var2;
  _func_int **pp_Var3;
  _func_int **pp_Var4;
  _func_int **pp_Var5;
  bool bVar6;
  int iVar7;
  deUint32 dVar8;
  uint uVar9;
  uint uVar10;
  NativeDisplayFactory *factory;
  NativeWindowFactory *windowFactory;
  NativePixmapFactory *pNVar11;
  RenderContext *pRVar12;
  undefined4 extraout_var;
  _func_int **pp_Var13;
  Library *egl;
  NativePixmap *pixmap;
  undefined4 extraout_var_00;
  DynamicLibrary *this_01;
  NotSupportedError *this_02;
  InternalError *this_03;
  char *fileName;
  WindowSurfacePair WVar14;
  EGLint major;
  EGLint minor;
  EGLint numSamples;
  EGLint stencilBits;
  EGLint depthBits;
  EGLint height;
  EGLint width;
  undefined1 local_98 [12];
  int iStack_8c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  int local_78;
  PixelFormat local_68;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  _func_int **local_40;
  RenderTarget *local_38;
  
  factory = selectNativeDisplayFactory(this->m_displayFactoryRegistry,cmdLine);
  windowFactory = selectNativeWindowFactory(factory,cmdLine);
  pNVar11 = selectNativePixmapFactory(factory,cmdLine);
  pRVar12 = (RenderContext *)operator_new(0x1ad8);
  pRVar12->_vptr_RenderContext = (_func_int **)&PTR__RenderContext_0076ac70;
  pp_Var13 = *(_func_int ***)&config->height;
  pp_Var2 = *(_func_int ***)&config->windowVisibility;
  pp_Var3 = *(_func_int ***)&config->redBits;
  pp_Var4 = *(_func_int ***)&config->blueBits;
  pp_Var5 = *(_func_int ***)&config->depthBits;
  pRVar12[1]._vptr_RenderContext = *(_func_int ***)config;
  pRVar12[2]._vptr_RenderContext = pp_Var13;
  pRVar12[3]._vptr_RenderContext = pp_Var2;
  pRVar12[4]._vptr_RenderContext = pp_Var3;
  pRVar12[5]._vptr_RenderContext = pp_Var4;
  pRVar12[6]._vptr_RenderContext = pp_Var5;
  pRVar12[7]._vptr_RenderContext = *(_func_int ***)&config->numSamples;
  pRVar12[8]._vptr_RenderContext = (_func_int **)windowFactory;
  local_38 = (RenderTarget *)(pRVar12 + 0x10);
  pRVar12[0xb]._vptr_RenderContext = (_func_int **)0x0;
  pRVar12[0xc]._vptr_RenderContext = (_func_int **)0x0;
  pRVar12[9]._vptr_RenderContext = (_func_int **)0x0;
  pRVar12[10]._vptr_RenderContext = (_func_int **)0x0;
  pRVar12[0xe]._vptr_RenderContext = (_func_int **)0x0;
  pRVar12[0xf]._vptr_RenderContext = (_func_int **)0x0;
  tcu::RenderTarget::RenderTarget(local_38);
  pRVar12[0x15]._vptr_RenderContext = (_func_int **)0x0;
  this_00 = (Functions *)(pRVar12 + 0x16);
  glw::Functions::Functions(this_00);
  SVar1 = config->surfaceType;
  iVar7 = (*(factory->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[3])(factory,0);
  pRVar12[9]._vptr_RenderContext = (_func_int **)CONCAT44(extraout_var,iVar7);
  pp_Var13 = (_func_int **)getDisplay((NativeDisplay *)CONCAT44(extraout_var,iVar7));
  pRVar12[0xc]._vptr_RenderContext = pp_Var13;
  egl = (Library *)(**(code **)(*pRVar12[9]._vptr_RenderContext + 0x10))();
  local_98._0_8_ = (ulong)(uint)local_98._4_4_ << 0x20;
  local_68._0_8_ = (ulong)(uint)local_68.greenBits << 0x20;
  (*egl->_vptr_Library[0x25])(egl,pRVar12[0xc]._vptr_RenderContext);
  dVar8 = (*egl->_vptr_Library[0x1f])(egl);
  checkError(dVar8,"initialize(m_eglDisplay, &major, &minor)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLContextFactory.cpp"
             ,0x142);
  pp_Var13 = (_func_int **)chooseConfig(egl,pRVar12[0xc]._vptr_RenderContext,config);
  pRVar12[0xd]._vptr_RenderContext = pp_Var13;
  switch(SVar1) {
  case SURFACETYPE_DONT_CARE:
    uVar9 = getConfigAttribInt(egl,pRVar12[0xc]._vptr_RenderContext,pp_Var13,0x3033);
    if ((uVar9 & 4) != 0) goto switchD_0028fd6f_caseD_1;
    if ((uVar9 & 1) != 0) {
      pp_Var13 = pRVar12[0xd]._vptr_RenderContext;
      goto switchD_0028fd6f_caseD_3;
    }
    if ((uVar9 & 2) == 0) {
      this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_02,"Selected EGL config doesn\'t support any surface types",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLContextFactory.cpp"
                 ,0x153);
      goto LAB_0029025a;
    }
  case SURFACETYPE_OFFSCREEN_NATIVE:
    if (pNVar11 == (NativePixmapFactory *)0x0) {
      this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_02,"EGL platform doesn\'t support pixmaps",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLContextFactory.cpp"
                 ,0x16e);
LAB_0029025a:
      __cxa_throw(this_02,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    nativeDisplay = (NativeDisplay *)pRVar12[9]._vptr_RenderContext;
    local_40 = pRVar12[0xc]._vptr_RenderContext;
    pp_Var13 = pRVar12[0xd]._vptr_RenderContext;
    local_98._0_8_ = (pointer)0x3038;
    pixmap = (NativePixmap *)(**(code **)(*(long *)pNVar11 + 0x20))(pNVar11,nativeDisplay);
    pp_Var13 = (_func_int **)
               createPixmapSurface(nativeDisplay,pixmap,local_40,pp_Var13,(EGLAttrib *)local_98);
    pRVar12[0xb]._vptr_RenderContext = (_func_int **)pixmap;
    break;
  case SURFACETYPE_WINDOW:
switchD_0028fd6f_caseD_1:
    if (windowFactory == (NativeWindowFactory *)0x0) {
      this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_02,"EGL platform doesn\'t support windows",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLContextFactory.cpp"
                 ,0x161);
      goto LAB_0029025a;
    }
    WVar14 = anon_unknown_1::createWindow
                       ((NativeDisplay *)pRVar12[9]._vptr_RenderContext,windowFactory,
                        pRVar12[0xc]._vptr_RenderContext,pRVar12[0xd]._vptr_RenderContext,config);
    pp_Var13 = (_func_int **)WVar14.second;
    pRVar12[10]._vptr_RenderContext = (_func_int **)WVar14.first;
    break;
  case SURFACETYPE_OFFSCREEN_GENERIC:
switchD_0028fd6f_caseD_3:
    local_98._4_4_ = config->width;
    if (config->width == -1) {
      local_98._4_4_ = 0x200;
    }
    iVar7 = config->height;
    if (config->height == -1) {
      iVar7 = 0x200;
    }
    local_98._0_4_ = 0x3057;
    stack0xffffffffffffff70 = (Library *)CONCAT44(iVar7,0x3056);
    local_88._M_allocated_capacity._0_4_ = 0x3038;
    iVar7 = (*egl->_vptr_Library[10])(egl,pRVar12[0xc]._vptr_RenderContext,pp_Var13);
    pp_Var13 = (_func_int **)CONCAT44(extraout_var_00,iVar7);
    dVar8 = (*egl->_vptr_Library[0x1f])(egl);
    checkError(dVar8,"eglCreatePbufferSurface()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLContextFactory.cpp"
               ,0x123);
    break;
  default:
    this_03 = (InternalError *)__cxa_allocate_exception(0x38);
    local_98._0_8_ = &local_88;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"Invalid surface type","");
    tcu::InternalError::InternalError(this_03,(string *)local_98);
    __cxa_throw(this_03,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
  }
  pRVar12[0xe]._vptr_RenderContext = pp_Var13;
  pp_Var13 = (_func_int **)
             createGLContext(egl,pRVar12[0xc]._vptr_RenderContext,pRVar12[0xd]._vptr_RenderContext,
                             &config->type,config->resetNotificationStrategy);
  pRVar12[0xf]._vptr_RenderContext = pp_Var13;
  (*egl->_vptr_Library[0x27])
            (egl,pRVar12[0xc]._vptr_RenderContext,pRVar12[0xe]._vptr_RenderContext,
             pRVar12[0xe]._vptr_RenderContext,pp_Var13);
  dVar8 = (*egl->_vptr_Library[0x1f])(egl);
  checkError(dVar8,"makeCurrent(m_eglDisplay, m_eglSurface, m_eglSurface, m_eglContext)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLContextFactory.cpp"
             ,0x17c);
  pp_Var13 = pRVar12[0xc]._vptr_RenderContext;
  local_68.redBits = 0x1e;
  local_68.greenBits = 0;
  local_98._0_8_ = &local_88;
  local_98._0_8_ = std::__cxx11::string::_M_create((ulong *)local_98,(ulong)&local_68);
  local_88._M_allocated_capacity._0_4_ = local_68.redBits;
  local_88._M_allocated_capacity._4_4_ = local_68.greenBits;
  *(char *)(local_98._0_8_ + 0xe) = 'l';
  *(char *)(local_98._0_8_ + 0xf) = '_';
  *(char *)(local_98._0_8_ + 0x10) = 'p';
  *(char *)(local_98._0_8_ + 0x11) = 'r';
  *(char *)(local_98._0_8_ + 0x12) = 'o';
  *(char *)(local_98._0_8_ + 0x13) = 'c';
  *(char *)(local_98._0_8_ + 0x14) = '_';
  *(char *)(local_98._0_8_ + 0x15) = 'a';
  *(char *)(local_98._0_8_ + 0x16) = 'd';
  *(char *)(local_98._0_8_ + 0x17) = 'd';
  *(char *)(local_98._0_8_ + 0x18) = 'r';
  *(char *)(local_98._0_8_ + 0x19) = 'e';
  *(char *)(local_98._0_8_ + 0x1a) = 's';
  *(char *)(local_98._0_8_ + 0x1b) = 's';
  *(char *)(local_98._0_8_ + 0x1c) = 'e';
  *(char *)(local_98._0_8_ + 0x1d) = 's';
  *(undefined8 *)local_98._0_8_ = 0x5f52484b5f4c4745;
  *(char *)(local_98._0_8_ + 8) = 'g';
  *(char *)(local_98._0_8_ + 9) = 'e';
  *(char *)(local_98._0_8_ + 10) = 't';
  *(char *)(local_98._0_8_ + 0xb) = '_';
  *(char *)(local_98._0_8_ + 0xc) = 'a';
  *(char *)(local_98._0_8_ + 0xd) = 'l';
  *(char *)(local_98._0_8_ + 0xe) = 'l';
  *(char *)(local_98._0_8_ + 0xf) = '_';
  local_98._8_4_ = local_68.redBits;
  iStack_8c = local_68.greenBits;
  *(char *)(local_98._0_8_ + local_68._0_8_) = '\0';
  bVar6 = hasExtension(egl,pp_Var13,(string *)local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._0_8_ != &local_88) {
    operator_delete((void *)local_98._0_8_,local_88._M_allocated_capacity + 1);
  }
  if (bVar6) {
    local_98._0_8_ = &PTR_get_0076ad00;
    unique0x10000fe0 = egl;
    glu::initCoreFunctions
              (this_00,(FunctionLoader *)local_98,
               (ApiType)((config->type).super_ApiType.m_bits & 0x3ff));
  }
  else {
    uVar9 = (config->type).super_ApiType.m_bits;
    uVar10 = uVar9 & 0x3ff;
    if (uVar10 == 3) {
      glw::initES30Direct(this_00);
    }
    else if (uVar10 == 2) {
      glw::initES20Direct(this_00);
    }
    else {
      this_01 = (DynamicLibrary *)operator_new(8);
      fileName = "libGL.so";
      if ((uVar9 & 0x300) == 0) {
        fileName = "libGLESv2.so";
      }
      de::DynamicLibrary::DynamicLibrary(this_01,fileName);
      pRVar12[0x15]._vptr_RenderContext = (_func_int **)this_01;
      local_98._0_8_ = &PTR_get_0076ad30;
      unique0x10000fd8 = (Library *)this_01;
      glu::initCoreFunctions
                (this_00,(FunctionLoader *)local_98,
                 (ApiType)((config->type).super_ApiType.m_bits & 0x3ff));
    }
  }
  local_98._0_8_ = &PTR_get_0076ad00;
  unique0x10000fe8 = egl;
  glu::initExtensionFunctions
            (this_00,(FunctionLoader *)local_98,
             (ApiType)((config->type).super_ApiType.m_bits & 0x3ff));
  local_68.redBits = 0;
  local_68.greenBits = 0;
  local_68.blueBits = 0;
  local_68.alphaBits = 0;
  (*egl->_vptr_Library[0x2b])
            (egl,pRVar12[0xc]._vptr_RenderContext,pRVar12[0xe]._vptr_RenderContext,0x3057,&local_44)
  ;
  (*egl->_vptr_Library[0x2b])
            (egl,pRVar12[0xc]._vptr_RenderContext,pRVar12[0xe]._vptr_RenderContext,0x3056,&local_48)
  ;
  (*egl->_vptr_Library[0x19])
            (egl,pRVar12[0xc]._vptr_RenderContext,pRVar12[0xd]._vptr_RenderContext,0x3024,&local_68)
  ;
  (*egl->_vptr_Library[0x19])
            (egl,pRVar12[0xc]._vptr_RenderContext,pRVar12[0xd]._vptr_RenderContext,0x3023,
             &local_68.greenBits);
  (*egl->_vptr_Library[0x19])
            (egl,pRVar12[0xc]._vptr_RenderContext,pRVar12[0xd]._vptr_RenderContext,0x3022,
             &local_68.blueBits);
  (*egl->_vptr_Library[0x19])
            (egl,pRVar12[0xc]._vptr_RenderContext,pRVar12[0xd]._vptr_RenderContext,0x3021,
             &local_68.alphaBits);
  (*egl->_vptr_Library[0x19])
            (egl,pRVar12[0xc]._vptr_RenderContext,pRVar12[0xd]._vptr_RenderContext,0x3025,&local_4c)
  ;
  (*egl->_vptr_Library[0x19])
            (egl,pRVar12[0xc]._vptr_RenderContext,pRVar12[0xd]._vptr_RenderContext,0x3026,&local_50)
  ;
  (*egl->_vptr_Library[0x19])
            (egl,pRVar12[0xc]._vptr_RenderContext,pRVar12[0xd]._vptr_RenderContext,0x3031,&local_54)
  ;
  dVar8 = (*egl->_vptr_Library[0x1f])(egl);
  checkError(dVar8,"Failed to query config attributes",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLContextFactory.cpp"
             ,0x1c8);
  tcu::RenderTarget::RenderTarget
            ((RenderTarget *)local_98,local_44,local_48,&local_68,local_4c,local_50,local_54);
  local_38->m_numSamples = local_78;
  (local_38->m_pixelFormat).blueBits = local_88._M_allocated_capacity._0_4_;
  (local_38->m_pixelFormat).alphaBits = local_88._M_allocated_capacity._4_4_;
  local_38->m_depthBits = local_88._8_4_;
  local_38->m_stencilBits = local_88._12_4_;
  local_38->m_width = local_98._0_4_;
  local_38->m_height = local_98._4_4_;
  *(Library **)&local_38->m_pixelFormat = stack0xffffffffffffff70;
  return pRVar12;
}

Assistant:

glu::RenderContext* GLContextFactory::createContext (const glu::RenderConfig& config, const tcu::CommandLine& cmdLine) const
{
	const NativeDisplayFactory& displayFactory = selectNativeDisplayFactory(m_displayFactoryRegistry, cmdLine);

	const NativeWindowFactory*	windowFactory;
	const NativePixmapFactory*	pixmapFactory;

	try
	{
		windowFactory = &selectNativeWindowFactory(displayFactory, cmdLine);
	}
	catch (const tcu::NotSupportedError&)
	{
		windowFactory = DE_NULL;
	}

	try
	{
		pixmapFactory = &selectNativePixmapFactory(displayFactory, cmdLine);
	}
	catch (const tcu::NotSupportedError&)
	{
		pixmapFactory = DE_NULL;
	}

	return new RenderContext(&displayFactory, windowFactory, pixmapFactory, config);
}